

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::DataBreakpoint>::destruct
          (BasicTypeInfo<dap::DataBreakpoint> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::DataBreakpoint> *this_local;
  
  DataBreakpoint::~DataBreakpoint((DataBreakpoint *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }